

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::OutputFile::OutputFile(OutputFile *this,OStream *os,Header *header,int numThreads)

{
  Data **ppDVar1;
  int iVar2;
  Data *pDVar3;
  OutputStreamMutex *pOVar4;
  undefined4 extraout_var;
  Int64 IVar5;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile = (_func_int **)&PTR__OutputFile_02fa67d8;
  pDVar3 = (Data *)operator_new(0x148);
  Data::Data(pDVar3,numThreads);
  ppDVar1 = &this->_data;
  *ppDVar1 = pDVar3;
  pOVar4 = (OutputStreamMutex *)operator_new(0x38);
  (pOVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pOVar4->os = (OStream *)0x0;
  *(undefined8 *)((long)&(pOVar4->super_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pOVar4->super_Mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pOVar4->super_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pOVar4->super_Mutex).super___mutex_base._M_mutex + 8) = 0;
  pOVar4->currentPosition = 0;
  pDVar3->_streamData = pOVar4;
  pDVar3->_deleteStream = false;
  Header::sanityCheck(header,false,false);
  pDVar3 = this->_data;
  pDVar3->_streamData->os = os;
  pDVar3->multiPart = false;
  initialize(this,header);
  iVar2 = (*(*ppDVar1)->_streamData->os->_vptr_OStream[3])();
  pDVar3 = this->_data;
  pOVar4 = pDVar3->_streamData;
  pOVar4->currentPosition = CONCAT44(extraout_var,iVar2);
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,pOVar4->os,&pDVar3->header);
  IVar5 = Header::writeTo(&(*ppDVar1)->header,(*ppDVar1)->_streamData->os,false);
  pDVar3 = *ppDVar1;
  pDVar3->previewPosition = IVar5;
  IVar5 = anon_unknown_7::writeLineOffsets(pDVar3->_streamData->os,&pDVar3->lineOffsets);
  (*ppDVar1)->lineOffsetsPosition = IVar5;
  return;
}

Assistant:

OutputFile::OutputFile
    (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os,
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))
{
    _data->_streamData=new OutputStreamMutex ();
    _data->_deleteStream=false;
    try
    {
        header.sanityCheck();
        _data->_streamData->os = &os;
        _data->multiPart=false;
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
            writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData)
                delete _data->_streamData;
            delete _data;
        }

        REPLACE_EXC (e, "Cannot open image file "
                     "\"" << os.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData)
                delete _data->_streamData;
            delete _data;
        }

        throw;
    }
}